

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void printBuffer(InputBuffer *buf)

{
  ostream *poVar1;
  istream is;
  undefined1 local_198 [400];
  
  avro::istream::istream((istream *)local_198,buf);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      *(streambuf **)
                       (*(_func_int **)(local_198._0_8_ + -0x18) + (long)(local_198 + 0xe8)));
  std::endl<char,std::char_traits<char>>(poVar1);
  avro::istream::~istream((istream *)local_198);
  return;
}

Assistant:

void printBuffer(const InputBuffer &buf) 
{
    avro::istream is(buf);
    cout << is.rdbuf() << endl;
}